

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O1

int gdRotatedImageSize(gdImagePtr src,float angle,gdRectPtr bbox)

{
  int iVar1;
  gdRect src_area;
  double m [6];
  gdRect local_58;
  double local_48 [6];
  
  gdAffineRotate(local_48,(double)angle);
  local_58.x = 0;
  local_58.y = 0;
  local_58.width = src->sx;
  local_58.height = src->sy;
  iVar1 = gdTransformAffineBoundingBox(&local_58,local_48,bbox);
  return iVar1;
}

Assistant:

static int gdRotatedImageSize(gdImagePtr src, const float angle, gdRectPtr bbox)
{
    gdRect src_area;
    double m[6];

    gdAffineRotate(m, angle);
    src_area.x = 0;
    src_area.y = 0;
    src_area.width = gdImageSX(src);
    src_area.height = gdImageSY(src);
    if (gdTransformAffineBoundingBox(&src_area, m, bbox) != GD_TRUE) {
        return GD_FALSE;
    }

    return GD_TRUE;
}